

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O2

void __thiscall TxReconciliationTracker::Impl::ForgetPeer(Impl *this,NodeId peer_id)

{
  unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
  *this_00;
  __node_base *p_Var1;
  size_type *psVar2;
  long lVar3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  char *__code;
  ulong __bkt;
  ulong uVar8;
  Level level;
  __buckets_ptr pp_Var9;
  _Hash_node_base *category;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  char *in_stack_ffffffffffffffb0;
  NodeId peer_id_local;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock13;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  __code = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
  ;
  peer_id_local = peer_id;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock13,&this->m_txreconciliation_mutex,"m_txreconciliation_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
             ,0x83,false);
  this_00 = &this->m_states;
  uVar8 = (this->m_states)._M_h._M_bucket_count;
  __bkt = (ulong)peer_id % uVar8;
  p_Var6 = std::
           _Hashtable<long,_std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node(&this_00->_M_h,__bkt,&peer_id_local,(__hash_code)__code);
  if (p_Var6 == (__node_base_ptr)0x0) goto LAB_0024ad20;
  category = p_Var6->_M_nxt;
  pp_Var9 = (this_00->_M_h)._M_buckets;
  p_Var4 = category->_M_nxt;
  if (pp_Var9[__bkt] == p_Var6) {
    p_Var7 = p_Var6;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      uVar8 = (ulong)p_Var4[1]._M_nxt % uVar8;
      if (uVar8 == __bkt) goto LAB_0024acdb;
      pp_Var9[uVar8] = pp_Var9[__bkt];
      pp_Var9 = (this_00->_M_h)._M_buckets;
      p_Var7 = pp_Var9[__bkt];
    }
    p_Var1 = &(this->m_states)._M_h._M_before_begin;
    if (p_Var1 == p_Var7) {
      p_Var1->_M_nxt = p_Var4;
    }
    pp_Var9[__bkt] = (__node_base_ptr)0x0;
  }
  else if ((p_Var4 != (_Hash_node_base *)0x0) &&
          (uVar8 = (ulong)p_Var4[1]._M_nxt % uVar8, uVar8 != __bkt)) {
    pp_Var9[uVar8] = p_Var6;
  }
LAB_0024acdb:
  p_Var6->_M_nxt = category->_M_nxt;
  level = 0x30;
  operator_delete(category,0x30);
  psVar2 = &(this->m_states)._M_h._M_element_count;
  *psVar2 = *psVar2 - 1;
  bVar5 = ::LogAcceptCategory((LogFlags)category,level);
  if (bVar5) {
    logging_function._M_str = "ForgetPeer";
    logging_function._M_len = 10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
    ;
    source_file._M_len = 0x62;
    LogPrintf_<long>(logging_function,source_file,0x85,
                     I2P|VALIDATION|QT|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|REINDEX|WALLETDB|ZMQ|TOR|NET,
                     (Level)&peer_id_local,in_stack_ffffffffffffffb0,(long *)peer_id_local);
  }
LAB_0024ad20:
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        if (m_states.erase(peer_id)) {
            LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Forget txreconciliation state of peer=%d\n", peer_id);
        }
    }